

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

value * __thiscall mjs::object::get(value *__return_storage_ptr__,object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute a;
  gc_heap *h;
  object *this_00;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar2;
  property *local_70;
  property *it_1;
  object *proto;
  size_t sStack_48;
  gc_heap_ptr_untracked<mjs::object,_true> p;
  property *local_38;
  property *it;
  wstring_view *name_local;
  object *this_local;
  
  sStack_48 = name->_M_len;
  pVar2 = find(this,*name);
  local_38 = pVar2.first;
  if (local_38 == (property *)0x0) {
    proto._4_4_ = (this->prototype_).pos_;
    while (bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                             ((gc_heap_ptr_untracked *)((long)&proto + 4)), bVar1) {
      h = heap(this);
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference
                          ((gc_heap_ptr_untracked<mjs::object,_true> *)((long)&proto + 4),h);
      pVar2 = find(this_00,*name);
      local_70 = pVar2.first;
      if (local_70 != (property *)0x0) {
        property::get(__return_storage_ptr__,local_70,this);
        return __return_storage_ptr__;
      }
      a = own_property_attributes(this_00,name);
      bVar1 = is_valid(a);
      if (bVar1) {
        (**this_00->_vptr_object)(__return_storage_ptr__,this_00,name);
        return __return_storage_ptr__;
      }
      proto._4_4_ = (this_00->prototype_).pos_;
    }
    value::value(__return_storage_ptr__,(value *)value::undefined);
  }
  else {
    property::get(__return_storage_ptr__,local_38,this);
  }
  return __return_storage_ptr__;
}

Assistant:

value object::get(const std::wstring_view& name) const {
    if (auto it = find(name).first) {
        return it->get(*this);
    }
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name).first) {
            return it->get(*this);
        } else if (is_valid(proto.own_property_attributes(name))) {
            return proto.get(name);
        }
        p = proto.prototype_;
    }

    return value::undefined;
}